

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::interval_t,long,duckdb::UnaryOperatorWrapper,duckdb::DatePart::ISOYearOperator>
               (interval_t *ldata,long *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  bool bVar1;
  date_t input;
  date_t input_00;
  vector<duckdb::BaseStatistics,_true> *pvVar2;
  reference pvVar3;
  long val;
  long val_00;
  LogicalType *other;
  ValidityMask *unaff_RBX;
  SelectionVector *unaff_R12;
  vector<duckdb::BaseStatistics,_true> *unaff_R13;
  idx_t i;
  ValidityMask *unaff_R14;
  interval_t input_01;
  Value VStack_108;
  LogicalType LStack_c8;
  BaseStatistics BStack_b0;
  ValidityMask *pVStack_58;
  SelectionVector *pSStack_50;
  vector<duckdb::BaseStatistics,_true> *pvStack_48;
  ValidityMask *pVStack_40;
  idx_t iStack_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count == 0) {
      return;
    }
  }
  else {
    unaff_R13 = (vector<duckdb::BaseStatistics,_true> *)0x0;
    while( true ) {
      if ((vector<duckdb::BaseStatistics,_true> *)count == unaff_R13) {
        return;
      }
      pvVar2 = unaff_R13;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pvVar2 = (vector<duckdb::BaseStatistics,_true> *)
                 (ulong)sel_vector->sel_vector[(long)unaff_R13];
      }
      unaff_RBX = result_mask;
      unaff_R12 = sel_vector;
      unaff_R14 = mask;
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)pvVar2 >> 6] >>
           ((ulong)pvVar2 & 0x3f) & 1) != 0) break;
      result_data = (long *)unaff_R13;
      ldata = (interval_t *)result_mask;
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,(idx_t)unaff_R13);
      unaff_R13 = (vector<duckdb::BaseStatistics,_true> *)
                  ((long)&(unaff_R13->
                          super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                          ).
                          super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  input_01.micros = (int64_t)result_data;
  input_01._0_8_ = ldata;
  DatePart::ISOYearOperator::Operation<duckdb::interval_t,long>(input_01);
  pVStack_58 = unaff_RBX;
  pSStack_50 = unaff_R12;
  pvStack_48 = unaff_R13;
  pVStack_40 = unaff_R14;
  iStack_38 = count;
  pvVar3 = vector<duckdb::BaseStatistics,_true>::get<true>
                     ((vector<duckdb::BaseStatistics,_true> *)result_data,0);
  bVar1 = NumericStats::HasMinMax(pvVar3);
  if (bVar1) {
    input = NumericStats::GetMin<duckdb::date_t>(pvVar3);
    input_00 = NumericStats::GetMax<duckdb::date_t>(pvVar3);
    if (((input.days <= input_00.days) && (bVar1 = Value::IsFinite<duckdb::date_t>(input), bVar1))
       && (bVar1 = Value::IsFinite<duckdb::date_t>(input_00), bVar1)) {
      val = DatePart::ISOYearOperator::Operation<duckdb::date_t,long>(input);
      val_00 = DatePart::ISOYearOperator::Operation<duckdb::date_t,long>(input_00);
      LogicalType::LogicalType(&LStack_c8,other);
      NumericStats::CreateEmpty(&BStack_b0,&LStack_c8);
      LogicalType::~LogicalType(&LStack_c8);
      Value::Value(&VStack_108,val);
      NumericStats::SetMin(&BStack_b0,&VStack_108);
      Value::~Value(&VStack_108);
      Value::Value(&VStack_108,val_00);
      NumericStats::SetMax(&BStack_b0,&VStack_108);
      Value::~Value(&VStack_108);
      pvVar3 = vector<duckdb::BaseStatistics,_true>::get<true>
                         ((vector<duckdb::BaseStatistics,_true> *)result_data,0);
      BaseStatistics::CopyValidity(&BStack_b0,pvVar3);
      BaseStatistics::ToUnique((BaseStatistics *)ldata);
      BaseStatistics::~BaseStatistics(&BStack_b0);
      return;
    }
  }
  (((BaseStatistics *)ldata)->type).id_ = INVALID;
  (((BaseStatistics *)ldata)->type).physical_type_ = ~INVALID;
  *(undefined6 *)&(((BaseStatistics *)ldata)->type).field_0x2 = 0;
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}